

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_alert_list_alert.cc
# Opt level: O2

int __thiscall
aliyun::Alert::ListAlert
          (Alert *this,AlertListAlertRequestType *req,AlertListAlertResponseType *response,
          AlertErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  AliRoaRequest *this_00;
  Value *pVVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  Value val;
  allocator<char> local_362;
  allocator<char> local_361;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string str_response;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string url;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  pcVar4 = "http";
  if (this->use_tls_ != false) {
    pcVar4 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar4,(allocator<char> *)&local_3a0);
  std::operator+(&local_340,&secheme,"://");
  std::operator+(&local_3a0,&local_340,this->host_);
  get_format_string_abi_cxx11_
            (&local_360,"/projects/%s/alerts",(req->project_name)._M_dataplus._M_p);
  std::operator+(&url,&local_3a0,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_340);
  this_00 = (AliRoaRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->version_,(allocator<char> *)&local_3a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->appid_,(allocator<char> *)&local_340);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,this->secret_,(allocator<char> *)&local_360);
  std::__cxx11::string::string((string *)&local_200,(string *)&url);
  AliRoaRequest::AliRoaRequest(this_00,&local_1a0,&local_1c0,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (((this->use_tls_ == false) && (pcVar4 = this->proxy_host_, pcVar4 != (char *)0x0)) &&
     (*pcVar4 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,pcVar4,(allocator<char> *)&local_3a0);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"GET",(allocator<char> *)&local_3a0);
  AliHttpRequest::setRequestMethod((AliHttpRequest *)this_00,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  if ((req->alert_name)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"AlertName",(allocator<char> *)&local_3a0);
    std::__cxx11::string::string((string *)&local_280,(string *)&req->alert_name);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->page)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"Page",(allocator<char> *)&local_3a0);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->page);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((req->page_size)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"PageSize",(allocator<char> *)&local_3a0);
    std::__cxx11::string::string((string *)&local_300,(string *)&req->page_size);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (AlertErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_3a0,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a0,anon_var_dwarf_19ca2b + 9,(allocator<char> *)&local_340);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_3a0);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_3a0,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a0,anon_var_dwarf_19ca2b + 9,(allocator<char> *)&local_360);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_3a0);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_3a0,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a0,anon_var_dwarf_19ca2b + 9,&local_361);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_3a0);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_3a0,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a0,anon_var_dwarf_19ca2b + 9,&local_362);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_3a0);
      }
      if (response != (AlertListAlertResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"code");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"code");
          Json::Value::asString_abi_cxx11_(&local_3a0,pVVar3);
          std::__cxx11::string::operator=((string *)response,(string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_3a0);
        }
        bVar1 = Json::Value::isMember(&val,"message");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"message");
          Json::Value::asString_abi_cxx11_(&local_3a0,pVVar3);
          std::__cxx11::string::operator=((string *)&response->message,(string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_3a0);
        }
        bVar1 = Json::Value::isMember(&val,"success");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"success");
          Json::Value::asString_abi_cxx11_(&local_3a0,pVVar3);
          std::__cxx11::string::operator=((string *)&response->success,(string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_3a0);
        }
        bVar1 = Json::Value::isMember(&val,"traceId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"traceId");
          Json::Value::asString_abi_cxx11_(&local_3a0,pVVar3);
          std::__cxx11::string::operator=((string *)&response->trace_id,(string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_3a0);
        }
        bVar1 = Json::Value::isMember(&val,"datapoints");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"datapoints");
          Json::Value::asString_abi_cxx11_(&local_3a0,pVVar3);
          std::__cxx11::string::operator=((string *)&response->datapoints,(string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_3a0);
        }
        bVar1 = Json::Value::isMember(&val,"total");
        iVar2 = 200;
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"total");
          Json::Value::asString_abi_cxx11_(&local_3a0,pVVar3);
          std::__cxx11::string::operator=((string *)&response->total,(string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_3a0);
        }
      }
      goto LAB_0013934f;
    }
  }
  iVar2 = -1;
  if (error_info != (AlertErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_0013934f:
  AliRoaRequest::~AliRoaRequest(this_00);
  operator_delete(this_00,0x2c8);
  std::__cxx11::string::~string((string *)&url);
  std::__cxx11::string::~string((string *)&secheme);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Alert::ListAlert(const AlertListAlertRequestType& req,
                      AlertListAlertResponseType* response,
                      AlertErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  Json::Value val;
  Json::Reader reader;
  std::string secheme = this->use_tls_ ? "https" : "http";
  std::string url = secheme  + "://" + host_ + get_format_string("/projects/%s/alerts", req.project_name.c_str());
  AliRoaRequest* req_rpc = new AliRoaRequest(version_,
                         appid_,
                         secret_,
                         url);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  req_rpc->setRequestMethod("GET");
  if(!req.alert_name.empty()) {
    req_rpc->AddRequestQuery("AlertName", req.alert_name);
  }
  if(!req.page.empty()) {
    req_rpc->AddRequestQuery("Page", req.page);
  }
  if(!req.page_size.empty()) {
    req_rpc->AddRequestQuery("PageSize", req.page_size);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}